

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O3

void __thiscall
mjs::string_object::add_own_property_names
          (string_object *this,vector<mjs::string,_std::allocator<mjs::string>_> *names,
          bool check_enumerable)

{
  uint32_t uVar1;
  gc_heap *h;
  gc_string *pgVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  uint uVar4;
  mjs *this_00;
  wstring local_70;
  wstring_view local_50;
  gc_heap_ptr_untyped local_40;
  
  if (this->is_v5_or_later_ == true) {
    pgVar2 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference
                       ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)
                        &(this->super_native_object).field_0x24,
                        (this->super_native_object).super_object.heap_);
    uVar1 = pgVar2->length_;
    if (uVar1 != 0) {
      h = (this->super_native_object).super_object.heap_;
      this_00 = (mjs *)0x0;
      uVar3 = extraout_RDX;
      do {
        index_string_abi_cxx11_(&local_70,this_00,(uint32_t)uVar3);
        local_50._M_len = local_70._M_string_length;
        local_50._M_str = local_70._M_dataplus._M_p;
        string::string((string *)&local_40,h,&local_50);
        std::vector<mjs::string,_std::allocator<mjs::string>_>::emplace_back<mjs::string>
                  (names,(string *)&local_40);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
        uVar3 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
          uVar3 = extraout_RDX_01;
        }
        uVar4 = (int)this_00 + 1;
        this_00 = (mjs *)(ulong)uVar4;
      } while (uVar1 != uVar4);
    }
  }
  native_object::add_own_property_names(&this->super_native_object,names,check_enumerable);
  return;
}

Assistant:

void add_own_property_names(std::vector<string>& names, bool check_enumerable) const override {
        if (is_v5_or_later_) {
            const auto s = view();
            auto& h = heap();
            for (auto i = 0U, l = static_cast<uint32_t>(s.length()); i < l; ++i) {
                names.push_back(string{h, index_string(i)});
            }
        }
        native_object::add_own_property_names(names, check_enumerable);
    }